

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * sqlite3ExprAnd(Parse *pParse,Expr *pLeft,Expr *pRight)

{
  sqlite3 *db_00;
  u32 f;
  sqlite3 *db;
  Expr *pRight_local;
  Expr *pLeft_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  pParse_local = (Parse *)pRight;
  if ((pLeft != (Expr *)0x0) && (pParse_local = (Parse *)pLeft, pRight != (Expr *)0x0)) {
    if ((((pLeft->flags | pRight->flags) & 0x20000003) == 0x20000000) && (pParse->eParseMode < 2)) {
      sqlite3ExprDeferredDelete(pParse,pLeft);
      sqlite3ExprDeferredDelete(pParse,pRight);
      pParse_local = (Parse *)sqlite3Expr(db_00,0x9b,"0");
    }
    else {
      pParse_local = (Parse *)sqlite3PExpr(pParse,0x2c,pLeft,pRight);
    }
  }
  return (Expr *)pParse_local;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprAnd(Parse *pParse, Expr *pLeft, Expr *pRight){
  sqlite3 *db = pParse->db;
  if( pLeft==0  ){
    return pRight;
  }else if( pRight==0 ){
    return pLeft;
  }else{
    u32 f = pLeft->flags | pRight->flags;
    if( (f&(EP_OuterON|EP_InnerON|EP_IsFalse))==EP_IsFalse
     && !IN_RENAME_OBJECT
    ){
      sqlite3ExprDeferredDelete(pParse, pLeft);
      sqlite3ExprDeferredDelete(pParse, pRight);
      return sqlite3Expr(db, TK_INTEGER, "0");
    }else{
      return sqlite3PExpr(pParse, TK_AND, pLeft, pRight);
    }
  }
}